

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

int __thiscall MatroskaDemuxer::matroska_parse_index(MatroskaDemuxer *this)

{
  long local_48;
  int64_t num_1;
  int64_t num;
  int64_t time;
  MatroskaDemuxIndex idx;
  uint32_t id;
  int res;
  MatroskaDemuxer *this_local;
  
  idx.time._4_4_ = 0;
  memset(&time,0,0x18);
  do {
    if (idx.time._4_4_ != 0) {
      return idx.time._4_4_;
    }
    idx.time._0_4_ = ebml_peek_id(this,&this->level_up);
    if ((uint32_t)idx.time == 0) {
      return -1;
    }
    if (this->level_up != 0) {
      this->level_up = this->level_up + -1;
      return idx.time._4_4_;
    }
    if ((uint32_t)idx.time == 0xbb) {
      idx.time._4_4_ = ebml_read_master(this,(uint32_t *)&idx.time);
      if (-1 < idx.time._4_4_) {
        time = -1;
        idx.track = -1;
        idx._10_6_ = 0xffffffffffff;
        idx.pos._0_2_ = -1;
        do {
          if (idx.time._4_4_ != 0) goto LAB_002c4474;
          idx.time._0_4_ = ebml_peek_id(this,&this->level_up);
          if ((uint32_t)idx.time == 0) {
            idx.time._4_4_ = -1;
            goto LAB_002c4474;
          }
          if (this->level_up != 0) {
            this->level_up = this->level_up + -1;
            goto LAB_002c4474;
          }
          if ((uint32_t)idx.time == 0xb3) {
            idx.time._4_4_ = ebml_read_uint(this,(uint32_t *)&idx.time,&num);
            if (-1 < idx.time._4_4_) {
              idx._8_8_ = num * this->time_scale;
            }
          }
          else if ((uint32_t)idx.time == 0xb7) {
            idx.time._4_4_ = ebml_read_master(this,(uint32_t *)&idx.time);
            if (-1 < idx.time._4_4_) {
              do {
                if (idx.time._4_4_ != 0) goto LAB_002c444d;
                idx.time._0_4_ = ebml_peek_id(this,&this->level_up);
                if ((uint32_t)idx.time == 0) {
                  idx.time._4_4_ = -1;
                  goto LAB_002c444d;
                }
                if (this->level_up != 0) {
                  this->level_up = this->level_up + -1;
                  goto LAB_002c444d;
                }
                if (((uint32_t)idx.time == 0xbf) || ((uint32_t)idx.time == 0xec)) {
                  idx.time._4_4_ = ebml_read_skip(this);
                }
                else if ((uint32_t)idx.time == 0xf1) {
                  idx.time._4_4_ = ebml_read_uint(this,(uint32_t *)&idx.time,&local_48);
                  if (-1 < idx.time._4_4_) {
                    time = local_48 + this->segment_start;
                  }
                }
                else if ((uint32_t)idx.time == 0xf7) {
                  idx.time._4_4_ = ebml_read_uint(this,(uint32_t *)&idx.time,&num_1);
                  if (-1 < idx.time._4_4_) {
                    idx.pos._0_2_ = (short)num_1;
                  }
                }
                else {
                  idx.time._4_4_ = ebml_read_skip(this);
                }
              } while (this->level_up == 0);
              this->level_up = this->level_up + -1;
            }
          }
          else if (((uint32_t)idx.time == 0xbf) || ((uint32_t)idx.time == 0xec)) {
            idx.time._4_4_ = ebml_read_skip(this);
          }
          else {
            idx.time._4_4_ = ebml_read_skip(this);
          }
LAB_002c444d:
        } while (this->level_up == 0);
        this->level_up = this->level_up + -1;
LAB_002c4474:
        if (((time != -1) && (idx._8_8_ != -1)) && ((short)idx.pos != -1)) {
          std::
          vector<MatroskaDemuxer::MatroskaDemuxIndex,_std::allocator<MatroskaDemuxer::MatroskaDemuxIndex>_>
          ::push_back(&this->indexes,(value_type *)&time);
        }
      }
    }
    else if (((uint32_t)idx.time == 0xbf) || ((uint32_t)idx.time == 0xec)) {
      idx.time._4_4_ = ebml_read_skip(this);
    }
    else {
      idx.time._4_4_ = ebml_read_skip(this);
    }
    if (this->level_up != 0) {
      this->level_up = this->level_up + -1;
      return idx.time._4_4_;
    }
  } while( true );
}

Assistant:

int MatroskaDemuxer::matroska_parse_index()
{
    int res = 0;
    uint32_t id;
    MatroskaDemuxIndex idx{};

    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            res = -BufferedReader::DATA_EOF;
            break;
        }
        if (level_up)
        {
            level_up--;
            break;
        }

        switch (id)
        {
        /* one single index entry ('point') */
        case MATROSKA_ID_POINTENTRY:
            if ((res = ebml_read_master(&id)) < 0)
                break;

            /* in the end, we hope to fill one entry with a
             * timestamp, a file position and a tracknum */
            idx.pos = ULLONG_MAX;
            idx.time = ULLONG_MAX;
            idx.track = -1;

            while (res == 0)
            {
                if ((id = ebml_peek_id(&level_up)) == 0)
                {
                    res = -BufferedReader::DATA_EOF;
                    break;
                }
                if (level_up)
                {
                    level_up--;
                    break;
                }

                switch (id)
                {
                /* one single index entry ('point') */
                case MATROSKA_ID_CUETIME:
                {
                    int64_t time;
                    if ((res = ebml_read_uint(&id, &time)) < 0)
                        break;
                    idx.time = time * time_scale;
                    break;
                }

                /* position in the file + track to which it
                 * belongs */
                case MATROSKA_ID_CUETRACKPOSITION:
                    if ((res = ebml_read_master(&id)) < 0)
                        break;

                    while (res == 0)
                    {
                        if ((id = ebml_peek_id(&level_up)) == 0)
                        {
                            res = -BufferedReader::DATA_EOF;
                            break;
                        }
                        if (level_up)
                        {
                            level_up--;
                            break;
                        }

                        switch (id)
                        {
                        /* track number */
                        case MATROSKA_ID_CUETRACK:
                        {
                            int64_t num;
                            if ((res = ebml_read_uint(&id, &num)) < 0)
                                break;
                            idx.track = static_cast<int16_t>(num);
                            break;
                        }

                        /* position in file */
                        case MATROSKA_ID_CUECLUSTERPOSITION:
                        {
                            int64_t num;
                            if ((res = ebml_read_uint(&id, &num)) < 0)
                                break;
                            idx.pos = num + segment_start;
                            break;
                        }
                        case EBML_ID_VOID:
                        case EBML_ID_CRC32:
                            res = ebml_read_skip();
                            break;
                        default:
                            res = ebml_read_skip();
                            LTRACE(LT_INFO, 0, "Unknown entry " << id << " in CuesTrackPositions");
                        }

                        if (level_up)
                        {
                            level_up--;
                            break;
                        }
                    }
                    break;
                case EBML_ID_VOID:
                case EBML_ID_CRC32:
                    res = ebml_read_skip();
                    break;
                default:
                    res = ebml_read_skip();
                    LTRACE(LT_INFO, 0, "Unknown entry " << id << " in cuespoint index");
                }

                if (level_up)
                {
                    level_up--;
                    break;
                }
            }

            /* so let's see if we got what we wanted */
            if (idx.pos != ULLONG_MAX && idx.time != ULLONG_MAX && idx.track != -1)
            {
                indexes.push_back(idx);
            }
            break;
        case EBML_ID_VOID:
        case EBML_ID_CRC32:
            res = ebml_read_skip();
            break;
        default:
            res = ebml_read_skip();
            LTRACE(LT_INFO, 0, "Unknown entry " << id << " in cues header");
        }

        if (level_up)
        {
            level_up--;
            break;
        }
    }

    return res;
}